

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O3

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double len1,double len2)

{
  double *pdVar1;
  undefined4 *puVar2;
  inner_join_e iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double x;
  double y;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  point_base<double> **pppVar13;
  uint uVar14;
  line_join_e lj;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dy2;
  undefined1 auVar23 [16];
  double dx2;
  double dy1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dx1;
  double dStack_80;
  
  dVar15 = this->m_width;
  x = v1->x;
  y = v1->y;
  dVar18 = v0->x;
  dStack_80 = v0->y;
  dVar21 = x - dVar18;
  dVar22 = y - dStack_80;
  auVar24._0_8_ = dVar15 * dVar21;
  auVar24._8_8_ = dVar15 * dVar22;
  auVar25._8_8_ = len1;
  auVar25._0_8_ = len1;
  auVar25 = divpd(auVar24,auVar25);
  dy1 = auVar25._0_8_;
  dx1 = auVar25._8_8_;
  dVar16 = v2->x;
  dVar17 = v2->y;
  dVar19 = dVar16 - x;
  dVar20 = dVar17 - y;
  auVar23._0_8_ = dVar15 * dVar19;
  auVar23._8_8_ = dVar15 * dVar20;
  auVar6._8_8_ = len2;
  auVar6._0_8_ = len2;
  auVar25 = divpd(auVar23,auVar6);
  dy2 = auVar25._0_8_;
  dx2 = auVar25._8_8_;
  vc->m_size = 0;
  dVar19 = dVar22 * dVar19 - dVar20 * dVar21;
  if (((dVar19 == 0.0) && (!NAN(dVar19))) || (dVar15 <= 0.0 == 0.0 < dVar19)) {
    dVar15 = (dx1 + dx2) * 0.5;
    dVar19 = (dy1 + dy2) * 0.5;
    dVar15 = SQRT(dVar15 * dVar15 + dVar19 * dVar19);
    lj = this->m_line_join;
    if (((lj & ~miter_join_revert) == round_join) &&
       ((this->m_width_abs - dVar15) * this->m_approx_scale < this->m_width_eps)) {
      dVar20 = (dx2 + dVar16) - (dx2 + x);
      dVar15 = (dVar17 - dy2) - (y - dy2);
      dVar18 = dVar18 + dx1;
      dStack_80 = dStack_80 - dy1;
      dVar16 = (x + dx1) - dVar18;
      dVar17 = (y - dy1) - dStack_80;
      dVar19 = dVar16 * dVar15 - dVar17 * dVar20;
      if (ABS(dVar19) < 1e-30) {
        uVar11 = 0;
        if (vc->m_num_blocks == 0) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
          uVar11 = vc->m_size;
        }
        pdVar1 = (double *)((long)&(*vc->m_blocks)->x + (ulong)((uVar11 & 0x3f) << 4));
        *pdVar1 = x + dx1;
        pdVar1[1] = y - dy1;
      }
      else {
        dVar19 = ((dStack_80 - (y - dy2)) * dVar20 - (dVar18 - (dx2 + x)) * dVar15) / dVar19;
        dVar18 = dVar19 * dVar16 + dVar18;
        dStack_80 = dVar19 * dVar17 + dStack_80;
        uVar11 = 0;
        if (vc->m_num_blocks == 0) {
          auVar4._8_4_ = SUB84(dStack_80,0);
          auVar4._0_8_ = dVar18;
          auVar4._12_4_ = (int)((ulong)dStack_80 >> 0x20);
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
          dStack_80 = auVar4._8_8_;
          uVar11 = vc->m_size;
        }
        auVar5._8_4_ = SUB84(dStack_80,0);
        auVar5._0_8_ = dVar18;
        auVar5._12_4_ = (int)((ulong)dStack_80 >> 0x20);
        *(undefined1 (*) [16])((long)&(*vc->m_blocks)->x + (ulong)((uVar11 & 0x3f) << 4)) = auVar5;
      }
      goto LAB_0011a5af;
    }
    if (miter_join_revert < lj) {
      if (lj == round_join) {
        calc_arc(this,vc,x,y,dx1,-dy1,dx2,-dy2);
        return;
      }
      if (lj != miter_join_round) goto LAB_0011a1d3;
    }
    dVar18 = this->m_miter_limit;
  }
  else {
    dVar15 = len1;
    if (len2 <= len1) {
      dVar15 = len2;
    }
    dVar15 = dVar15 / this->m_width_abs;
    dVar18 = this->m_inner_miter_limit;
    if (this->m_inner_miter_limit <= dVar15) {
      dVar18 = dVar15;
    }
    iVar3 = this->m_inner_join;
    if (iVar3 - inner_jag < 2) {
      dVar15 = (dx1 - dx2) * (dx1 - dx2) + (dy1 - dy2) * (dy1 - dy2);
      if ((len1 * len1 <= dVar15) || (len2 * len2 <= dVar15)) {
        uVar11 = vc->m_num_blocks;
        if (iVar3 == inner_jag) {
          uVar12 = 0;
          if (uVar11 == 0) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
            uVar12 = vc->m_size;
            uVar11 = vc->m_num_blocks;
          }
          pppVar13 = vc->m_blocks;
          pdVar1 = (double *)((long)&(*pppVar13)->x + (ulong)((uVar12 & 0x3f) << 4));
          *pdVar1 = x + dx1;
          pdVar1[1] = y - dy1;
          uVar12 = uVar12 + 1;
          vc->m_size = uVar12;
          uVar7 = *(undefined4 *)&v1->x;
          uVar8 = *(undefined4 *)((long)&v1->x + 4);
          uVar9 = *(undefined4 *)&v1->y;
          uVar10 = *(undefined4 *)((long)&v1->y + 4);
          uVar14 = uVar12 >> 6;
          if (uVar11 <= uVar14) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
            uVar12 = vc->m_size;
            uVar11 = vc->m_num_blocks;
            pppVar13 = vc->m_blocks;
          }
          puVar2 = (undefined4 *)((long)&pppVar13[uVar14]->x + (ulong)((uVar12 & 0x3f) << 4));
          *puVar2 = uVar7;
          puVar2[1] = uVar8;
          puVar2[2] = uVar9;
          puVar2[3] = uVar10;
          uVar12 = uVar12 + 1;
          vc->m_size = uVar12;
          dVar15 = v1->x;
          dVar18 = v1->y;
          uVar14 = uVar12 >> 6;
          if (uVar11 <= uVar14) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
            uVar12 = vc->m_size;
            pppVar13 = vc->m_blocks;
          }
          pdVar1 = (double *)((long)&pppVar13[uVar14]->x + (ulong)((uVar12 & 0x3f) << 4));
          *pdVar1 = dVar15 + dx2;
          pdVar1[1] = dVar18 - dy2;
          vc->m_size = uVar12 + 1;
          return;
        }
        uVar12 = 0;
        if (uVar11 == 0) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
          uVar12 = vc->m_size;
          uVar11 = vc->m_num_blocks;
        }
        pppVar13 = vc->m_blocks;
        pdVar1 = (double *)((long)&(*pppVar13)->x + (ulong)((uVar12 & 0x3f) << 4));
        *pdVar1 = x + dx1;
        pdVar1[1] = y - dy1;
        uVar12 = uVar12 + 1;
        vc->m_size = uVar12;
        uVar7 = *(undefined4 *)&v1->x;
        uVar8 = *(undefined4 *)((long)&v1->x + 4);
        uVar9 = *(undefined4 *)&v1->y;
        uVar10 = *(undefined4 *)((long)&v1->y + 4);
        uVar14 = uVar12 >> 6;
        if (uVar11 <= uVar14) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
          uVar12 = vc->m_size;
          pppVar13 = vc->m_blocks;
        }
        puVar2 = (undefined4 *)((long)&pppVar13[uVar14]->x + (ulong)((uVar12 & 0x3f) << 4));
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        puVar2[2] = uVar9;
        puVar2[3] = uVar10;
        vc->m_size = uVar12 + 1;
        calc_arc(this,vc,v1->x,v1->y,dx2,-dy2,dx1,-dy1);
        uVar7 = *(undefined4 *)&v1->x;
        uVar8 = *(undefined4 *)((long)&v1->x + 4);
        uVar9 = *(undefined4 *)&v1->y;
        uVar10 = *(undefined4 *)((long)&v1->y + 4);
        uVar11 = vc->m_size;
        uVar12 = vc->m_num_blocks;
        uVar14 = uVar11 >> 6;
        if (uVar12 <= uVar14) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
          uVar11 = vc->m_size;
          uVar12 = vc->m_num_blocks;
        }
        pppVar13 = vc->m_blocks;
        puVar2 = (undefined4 *)((long)&pppVar13[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4));
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        puVar2[2] = uVar9;
        puVar2[3] = uVar10;
        uVar11 = uVar11 + 1;
        vc->m_size = uVar11;
        dVar15 = v1->x;
        dVar18 = v1->y;
        uVar14 = uVar11 >> 6;
        if (uVar12 <= uVar14) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
          uVar11 = vc->m_size;
          pppVar13 = vc->m_blocks;
        }
        pdVar1 = (double *)((long)&pppVar13[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4));
        *pdVar1 = dVar15 + dx2;
        pdVar1[1] = dVar18 - dy2;
        goto LAB_0011a5af;
      }
    }
    else if (iVar3 != inner_miter) {
LAB_0011a1d3:
      uVar12 = vc->m_num_blocks;
      uVar11 = 0;
      if (uVar12 == 0) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
        uVar11 = vc->m_size;
        uVar12 = vc->m_num_blocks;
      }
      pppVar13 = vc->m_blocks;
      pdVar1 = (double *)((long)&(*pppVar13)->x + (ulong)((uVar11 & 0x3f) << 4));
      *pdVar1 = x + dx1;
      pdVar1[1] = y - dy1;
      uVar11 = uVar11 + 1;
      vc->m_size = uVar11;
      dVar15 = v1->x;
      dVar18 = v1->y;
      uVar14 = uVar11 >> 6;
      if (uVar12 <= uVar14) {
        pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar14);
        uVar11 = vc->m_size;
        pppVar13 = vc->m_blocks;
      }
      pdVar1 = (double *)((long)&pppVar13[uVar14]->x + (ulong)((uVar11 & 0x3f) << 4));
      *pdVar1 = dVar15 + dx2;
      pdVar1[1] = dVar18 - dy2;
LAB_0011a5af:
      vc->m_size = uVar11 + 1;
      return;
    }
    dVar15 = 0.0;
    lj = miter_join_revert;
  }
  calc_miter(this,vc,v0,v1,v2,dx1,dy1,dx2,dy2,lj,dVar18,dVar15);
  return;
}

Assistant:

void math_stroke<VC>::calc_join(VC& vc,
                                    const vertex_dist& v0, 
                                    const vertex_dist& v1, 
                                    const vertex_dist& v2,
                                    double len1, 
                                    double len2)
    {
        double dx1 = m_width * (v1.y - v0.y) / len1;
        double dy1 = m_width * (v1.x - v0.x) / len1;
        double dx2 = m_width * (v2.y - v1.y) / len2;
        double dy2 = m_width * (v2.x - v1.x) / len2;

        vc.remove_all();

        double cp = cross_product(v0.x, v0.y, v1.x, v1.y, v2.x, v2.y);
        if(cp != 0 && (cp > 0) == (m_width > 0))
        {
            // Inner join
            //---------------
            double limit = ((len1 < len2) ? len1 : len2) / m_width_abs;
            if(limit < m_inner_miter_limit)
            {
                limit = m_inner_miter_limit;
            }

            switch(m_inner_join)
            {
            default: // inner_bevel
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case inner_miter:
                calc_miter(vc,
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           miter_join_revert, 
                           limit, 0);
                break;

            case inner_jag:
            case inner_round:
                cp = (dx1-dx2) * (dx1-dx2) + (dy1-dy2) * (dy1-dy2);
                if(cp < len1 * len1 && cp < len2 * len2)
                {
                    calc_miter(vc,
                               v0, v1, v2, dx1, dy1, dx2, dy2, 
                               miter_join_revert, 
                               limit, 0);
                }
                else
                {
                    if(m_inner_join == inner_jag)
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        calc_arc(vc, v1.x, v1.y, dx2, -dy2, dx1, -dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                }
                break;
            }
        }
        else
        {
            // Outer join
            //---------------

            // Calculate the distance between v1 and 
            // the central point of the bevel line segment
            //---------------
            double dx = (dx1 + dx2) / 2;
            double dy = (dy1 + dy2) / 2;
            double dbevel = sqrt(dx * dx + dy * dy);

            if(m_line_join == round_join || m_line_join == bevel_join)
            {
                // This is an optimization that reduces the number of points 
                // in cases of almost collinear segments. If there's no
                // visible difference between bevel and miter joins we'd rather
                // use miter join because it adds only one point instead of two. 
                //
                // Here we calculate the middle point between the bevel points 
                // and then, the distance between v1 and this middle point. 
                // At outer joins this distance always less than stroke width, 
                // because it's actually the height of an isosceles triangle of
                // v1 and its two bevel points. If the difference between this
                // width and this value is small (no visible bevel) we can 
                // add just one point. 
                //
                // The constant in the expression makes the result approximately 
                // the same as in round joins and caps. You can safely comment 
                // out this entire "if".
                //-------------------
                if(m_approx_scale * (m_width_abs - dbevel) < m_width_eps)
                {
                    if(calc_intersection(v0.x + dx1, v0.y - dy1,
                                         v1.x + dx1, v1.y - dy1,
                                         v1.x + dx2, v1.y - dy2,
                                         v2.x + dx2, v2.y - dy2,
                                         &dx, &dy))
                    {
                        add_vertex(vc, dx, dy);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                    }
                    return;
                }
            }

            switch(m_line_join)
            {
            case miter_join:
            case miter_join_revert:
            case miter_join_round:
                calc_miter(vc, 
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           m_line_join, 
                           m_miter_limit,
                           dbevel);
                break;

            case round_join:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default: // Bevel join
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;
            }
        }
    }